

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.h
# Opt level: O2

char * __thiscall
btPoint2PointConstraint::serialize
          (btPoint2PointConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btVector3::serialize(&this->m_pivotInA,(btVector3FloatData *)((long)dataBuffer + 0x40));
  btVector3::serialize(&this->m_pivotInB,(btVector3FloatData *)((long)dataBuffer + 0x50));
  return "btPoint2PointConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btPoint2PointConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btPoint2PointConstraintData2* p2pData = (btPoint2PointConstraintData2*)dataBuffer;

	btTypedConstraint::serialize(&p2pData->m_typeConstraintData,serializer);
	m_pivotInA.serialize(p2pData->m_pivotInA);
	m_pivotInB.serialize(p2pData->m_pivotInB);

	return btPoint2PointConstraintDataName;
}